

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.cpp
# Opt level: O0

Output * anon_unknown.dwarf_7f4f::generate_output
                   (Output *__return_storage_ptr__,Manifest *manifest,Target *target,
                   xml_document *spec)

{
  bool bVar1;
  const_iterator pxVar2;
  char *pcVar3;
  char_t *pcVar4;
  size_type sVar5;
  bool local_8d9;
  allocator local_829;
  string local_828 [32];
  string local_808;
  allocator local_7e1;
  string local_7e0 [32];
  string local_7c0;
  allocator local_799;
  string local_798 [32];
  string local_778;
  allocator local_751;
  string local_750 [32];
  string local_730;
  undefined8 local_710;
  string local_708;
  xml_node_struct *local_6e8;
  string local_6e0;
  allocator local_6b9;
  string local_6b8 [32];
  string local_698;
  allocator local_671;
  string local_670 [32];
  undefined1 local_650 [8];
  string pointer_name;
  allocator local_609;
  string local_608 [32];
  undefined1 local_5e8 [8];
  string typedef_name;
  undefined1 local_5c0 [8];
  string function_name;
  xml_node cn;
  xpath_node ref_2;
  const_iterator __end1_4;
  const_iterator __begin1_4;
  xpath_node_set *local_548;
  xpath_node_set *__range1_4;
  char_t *local_538;
  xml_attribute local_530;
  char_t *local_528;
  allocator local_519;
  string local_518 [32];
  string local_4f8;
  xml_attribute local_4d8;
  string local_4d0;
  xml_node local_4b0;
  xml_node en;
  xpath_node ref_1;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  xpath_node_set *local_458;
  xpath_node_set *__range1_3;
  string local_448;
  allocator local_421;
  string local_420 [32];
  string local_400;
  xml_node_struct *local_3e0;
  xml_node_struct *local_3d8;
  string local_3d0;
  xml_node local_3b0;
  xml_node tn;
  xpath_node ref;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  xpath_node_set *local_358;
  xpath_node_set *__range1_2;
  string local_348 [32];
  string local_328;
  allocator local_301;
  string local_300 [32];
  string local_2e0;
  allocator local_2b9;
  string local_2b8 [32];
  string local_298;
  allocator local_271;
  string local_270 [32];
  string local_250;
  allocator local_229;
  string local_228 [32];
  undefined1 local_208 [8];
  string boolean_name_1;
  Feature *feature;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<(anonymous_namespace)::Feature,_std::allocator<(anonymous_namespace)::Feature>_>
  *__range1_1;
  string local_1c0 [32];
  string local_1a0;
  allocator local_179;
  string local_178 [32];
  string local_158;
  allocator local_131;
  string local_130 [32];
  string local_110;
  allocator local_e9;
  string local_e8 [32];
  string local_c8;
  allocator local_a1;
  string local_a0 [32];
  undefined1 local_80 [8];
  string boolean_name;
  string *extension;
  const_iterator __end1;
  const_iterator __begin1;
  vector<wire::string,_std::allocator<wire::string>_> *__range1;
  xml_document *spec_local;
  Target *target_local;
  Manifest *manifest_local;
  Output *output;
  
  Output::Output(__return_storage_ptr__);
  bVar1 = wire::string::operator==(&target->api,"gl");
  if (bVar1) {
    wire::string::operator=(&__return_storage_ptr__->api_name,(char (*) [7])"OpenGL");
  }
  else {
    bVar1 = wire::string::operator==(&target->api,"gles1");
    if ((bVar1) || (bVar1 = wire::string::operator==(&target->api,"gles2"), bVar1)) {
      wire::string::operator=(&__return_storage_ptr__->api_name,(char (*) [10])"OpenGL ES");
    }
  }
  __end1 = std::vector<wire::string,_std::allocator<wire::string>_>::begin(&manifest->extensions);
  extension = (string *)
              std::vector<wire::string,_std::allocator<wire::string>_>::end(&manifest->extensions);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_wire::string_*,_std::vector<wire::string,_std::allocator<wire::string>_>_>
                                     *)&extension), bVar1) {
    boolean_name._24_8_ =
         __gnu_cxx::
         __normal_iterator<const_wire::string_*,_std::vector<wire::string,_std::allocator<wire::string>_>_>
         ::operator*(&__end1);
    wire::string::string((string *)local_80,(string *)boolean_name._24_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"GL_",&local_a1);
    bVar1 = wire::string::starts_with((string *)local_80,(string *)local_a0);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    if (bVar1) {
      std::__cxx11::string::replace((ulong)local_80,0,(char *)0x3);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"#define \x01 1\n",&local_e9);
    wire::string::string<wire::string>(&local_c8,(string *)local_e8,(string *)boolean_name._24_8_);
    wire::string::operator+=(&__return_storage_ptr__->ext_macros,&local_c8);
    wire::string::~string(&local_c8);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"extern int \x01;\n",&local_131);
    wire::string::string<wire::string>(&local_110,(string *)local_130,(string *)local_80);
    wire::string::operator+=(&__return_storage_ptr__->ext_declarations,&local_110);
    wire::string::~string(&local_110);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_178,"GREGDEF int \x01 = 0;\n",&local_179);
    wire::string::string<wire::string>(&local_158,(string *)local_178,(string *)local_80);
    wire::string::operator+=(&__return_storage_ptr__->ext_definitions,&local_158);
    wire::string::~string(&local_158);
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1c0,"    \x01 = gregExtensionSupported(\"\x02\");\n",
               (allocator *)((long)&__range1_1 + 7));
    wire::string::string<wire::string,wire::string>
              (&local_1a0,(string *)local_1c0,(string *)local_80,(string *)boolean_name._24_8_);
    wire::string::operator+=(&__return_storage_ptr__->ext_loaders,&local_1a0);
    wire::string::~string(&local_1a0);
    std::__cxx11::string::~string(local_1c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_1 + 7));
    wire::string::~string((string *)local_80);
    __gnu_cxx::
    __normal_iterator<const_wire::string_*,_std::vector<wire::string,_std::allocator<wire::string>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             vector<(anonymous_namespace)::Feature,_std::allocator<(anonymous_namespace)::Feature>_>
             ::begin(&manifest->features);
  feature = (Feature *)
            std::
            vector<(anonymous_namespace)::Feature,_std::allocator<(anonymous_namespace)::Feature>_>
            ::end(&manifest->features);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_(anonymous_namespace)::Feature_*,_std::vector<(anonymous_namespace)::Feature,_std::allocator<(anonymous_namespace)::Feature>_>_>
                             *)&feature), bVar1) {
    boolean_name_1._24_8_ =
         __gnu_cxx::
         __normal_iterator<const_(anonymous_namespace)::Feature_*,_std::vector<(anonymous_namespace)::Feature,_std::allocator<(anonymous_namespace)::Feature>_>_>
         ::operator*(&__end1_1);
    wire::string::string((string *)local_208,(string *)boolean_name_1._24_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_228,"GL_",&local_229);
    bVar1 = wire::string::starts_with((string *)local_208,(string *)local_228);
    std::__cxx11::string::~string(local_228);
    std::allocator<char>::~allocator((allocator<char> *)&local_229);
    if (bVar1) {
      std::__cxx11::string::replace((ulong)local_208,0,(char *)0x3);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_270,"#define \x01 1\n",&local_271);
    wire::string::string<wire::string>
              (&local_250,(string *)local_270,(string *)boolean_name_1._24_8_);
    wire::string::operator+=(&__return_storage_ptr__->ver_macros,&local_250);
    wire::string::~string(&local_250);
    std::__cxx11::string::~string(local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b8,"extern int \x01;\n",&local_2b9);
    wire::string::string<wire::string>(&local_298,(string *)local_2b8,(string *)local_208);
    wire::string::operator+=(&__return_storage_ptr__->ver_declarations,&local_298);
    wire::string::~string(&local_298);
    std::__cxx11::string::~string(local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_300,"GREGDEF int \x01 = 0;\n",&local_301);
    wire::string::string<wire::string>(&local_2e0,(string *)local_300,(string *)local_208);
    wire::string::operator+=(&__return_storage_ptr__->ver_definitions,&local_2e0);
    wire::string::~string(&local_2e0);
    std::__cxx11::string::~string(local_300);
    std::allocator<char>::~allocator((allocator<char> *)&local_301);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_348,"    \x01 = gregVersionSupported(\x02, \x03);\n",
               (allocator *)((long)&__range1_2 + 7));
    wire::string::string<wire::string,unsigned_int,unsigned_int>
              (&local_328,(string *)local_348,(string *)local_208,
               (uint *)(boolean_name_1._24_8_ + 0x20),(uint *)(boolean_name_1._24_8_ + 0x24));
    wire::string::operator+=(&__return_storage_ptr__->ver_loaders,&local_328);
    wire::string::~string(&local_328);
    std::__cxx11::string::~string(local_348);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_2 + 7));
    wire::string::~string((string *)local_208);
    __gnu_cxx::
    __normal_iterator<const_(anonymous_namespace)::Feature_*,_std::vector<(anonymous_namespace)::Feature,_std::allocator<(anonymous_namespace)::Feature>_>_>
    ::operator++(&__end1_1);
  }
  pugi::xml_node::select_nodes
            ((xpath_node_set *)&__begin1_2,&spec->super_xml_node,"/registry/types/type",
             (xpath_variable_set *)0x0);
  local_358 = (xpath_node_set *)&__begin1_2;
  __end1_2 = pugi::xpath_node_set::begin(local_358);
  pxVar2 = pugi::xpath_node_set::end(local_358);
  for (; __end1_2 != pxVar2; __end1_2 = __end1_2 + 1) {
    tn._root = (__end1_2->_node)._root;
    local_3d8 = (xml_node_struct *)pugi::xpath_node::node((xpath_node *)&tn);
    local_3b0 = (xml_node)local_3d8;
    pcVar3 = type_name((xml_node)local_3d8);
    wire::string::string(&local_3d0,pcVar3);
    sVar5 = std::set<wire::string,_std::less<wire::string>,_std::allocator<wire::string>_>::count
                      (&manifest->types,&local_3d0);
    local_8d9 = true;
    if (sVar5 != 0) {
      local_3e0 = local_3b0._root;
      pcVar3 = api_name(local_3b0);
      local_8d9 = std::operator!=(pcVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)target);
    }
    wire::string::~string(&local_3d0);
    if (local_8d9 == false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_420,"\x01\n",&local_421);
      __range1_3 = (xpath_node_set *)local_3b0._root;
      scrape_type_text(&local_448,local_3b0);
      wire::string::string<wire::string>(&local_400,(string *)local_420,&local_448);
      wire::string::operator+=(&__return_storage_ptr__->type_typedefs,&local_400);
      wire::string::~string(&local_400);
      wire::string::~string(&local_448);
      std::__cxx11::string::~string(local_420);
      std::allocator<char>::~allocator((allocator<char> *)&local_421);
    }
  }
  pugi::xpath_node_set::~xpath_node_set((xpath_node_set *)&__begin1_2);
  pugi::xml_node::select_nodes
            ((xpath_node_set *)&__begin1_3,&spec->super_xml_node,"/registry/enums/enum",
             (xpath_variable_set *)0x0);
  local_458 = (xpath_node_set *)&__begin1_3;
  __end1_3 = pugi::xpath_node_set::begin(local_458);
  pxVar2 = pugi::xpath_node_set::end(local_458);
  for (; __end1_3 != pxVar2; __end1_3 = __end1_3 + 1) {
    en._root = (__end1_3->_node)._root;
    local_4b0 = pugi::xpath_node::node((xpath_node *)&en);
    local_4d8 = pugi::xml_node::attribute(&local_4b0,"name");
    pcVar4 = pugi::xml_attribute::value(&local_4d8);
    wire::string::string(&local_4d0,pcVar4);
    sVar5 = std::set<wire::string,_std::less<wire::string>,_std::allocator<wire::string>_>::count
                      (&manifest->enums,&local_4d0);
    wire::string::~string(&local_4d0);
    if (sVar5 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_518,"#define \x01 \x02\n",&local_519);
      local_530 = pugi::xml_node::attribute(&local_4b0,"name");
      local_528 = pugi::xml_attribute::value(&local_530);
      __range1_4 = (xpath_node_set *)pugi::xml_node::attribute(&local_4b0,"value");
      local_538 = pugi::xml_attribute::value((xml_attribute *)&__range1_4);
      wire::string::string<char_const*,char_const*>
                (&local_4f8,(string *)local_518,&local_528,&local_538);
      wire::string::operator+=(&__return_storage_ptr__->enum_definitions,&local_4f8);
      wire::string::~string(&local_4f8);
      std::__cxx11::string::~string(local_518);
      std::allocator<char>::~allocator((allocator<char> *)&local_519);
    }
  }
  pugi::xpath_node_set::~xpath_node_set((xpath_node_set *)&__begin1_3);
  pugi::xml_node::select_nodes
            ((xpath_node_set *)&__begin1_4,&spec->super_xml_node,"/registry/commands/command",
             (xpath_variable_set *)0x0);
  local_548 = (xpath_node_set *)&__begin1_4;
  __end1_4 = pugi::xpath_node_set::begin(local_548);
  pxVar2 = pugi::xpath_node_set::end(local_548);
  for (; __end1_4 != pxVar2; __end1_4 = __end1_4 + 1) {
    cn._root = (__end1_4->_node)._root;
    function_name._24_8_ = pugi::xpath_node::node((xpath_node *)&cn);
    typedef_name._24_8_ = pugi::xml_node::child((xml_node *)&function_name.field_0x18,"proto");
    pcVar4 = pugi::xml_node::child_value((xml_node *)&typedef_name.field_0x18,"name");
    wire::string::string((string *)local_5c0,pcVar4);
    sVar5 = std::set<wire::string,_std::less<wire::string>,_std::allocator<wire::string>_>::count
                      (&manifest->commands,(key_type *)local_5c0);
    if (sVar5 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_608,"PFN\x01PROC",&local_609);
      wire::string::uppercase((string *)&pointer_name.field_0x18,(string *)local_5c0);
      wire::string::string<wire::string>
                ((string *)local_5e8,(string *)local_608,(string *)&pointer_name.field_0x18);
      wire::string::~string((string *)&pointer_name.field_0x18);
      std::__cxx11::string::~string(local_608);
      std::allocator<char>::~allocator((allocator<char> *)&local_609);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_670,"greg_\x01",&local_671);
      wire::string::string<wire::string>
                ((string *)local_650,(string *)local_670,(string *)local_5c0);
      std::__cxx11::string::~string(local_670);
      std::allocator<char>::~allocator((allocator<char> *)&local_671);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6b8,"typedef \x01 (GLAPIENTRY *\x02)(\x03);\n",&local_6b9);
      local_6e8 = (xml_node_struct *)
                  pugi::xml_node::child((xml_node *)&function_name.field_0x18,"proto");
      scrape_proto_text(&local_6e0,(xml_node)local_6e8);
      local_710 = function_name._24_8_;
      command_params(&local_708,(xml_node)function_name._24_8_);
      wire::string::string<wire::string,wire::string,wire::string>
                (&local_698,(string *)local_6b8,&local_6e0,(string *)local_5e8,&local_708);
      wire::string::operator+=(&__return_storage_ptr__->cmd_typedefs,&local_698);
      wire::string::~string(&local_698);
      wire::string::~string(&local_708);
      wire::string::~string(&local_6e0);
      std::__cxx11::string::~string(local_6b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_750,"extern \x01 \x02;\n",&local_751);
      wire::string::string<wire::string,wire::string>
                (&local_730,(string *)local_750,(string *)local_5e8,(string *)local_650);
      wire::string::operator+=(&__return_storage_ptr__->cmd_declarations,&local_730);
      wire::string::~string(&local_730);
      std::__cxx11::string::~string(local_750);
      std::allocator<char>::~allocator((allocator<char> *)&local_751);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_798,"#define \x01 \x02\n",&local_799);
      wire::string::string<wire::string,wire::string>
                (&local_778,(string *)local_798,(string *)local_5c0,(string *)local_650);
      wire::string::operator+=(&__return_storage_ptr__->cmd_macros,&local_778);
      wire::string::~string(&local_778);
      std::__cxx11::string::~string(local_798);
      std::allocator<char>::~allocator((allocator<char> *)&local_799);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7e0,"GREGDEF \x01 \x02 = NULL;\n",&local_7e1);
      wire::string::string<wire::string,wire::string>
                (&local_7c0,(string *)local_7e0,(string *)local_5e8,(string *)local_650);
      wire::string::operator+=(&__return_storage_ptr__->cmd_definitions,&local_7c0);
      wire::string::~string(&local_7c0);
      std::__cxx11::string::~string(local_7e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_7e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_828,"    \x01 = (\x02) gregGetProcAddress(\"\x03\");\n",&local_829);
      wire::string::string<wire::string,wire::string,wire::string>
                (&local_808,(string *)local_828,(string *)local_650,(string *)local_5e8,
                 (string *)local_5c0);
      wire::string::operator+=(&__return_storage_ptr__->cmd_loaders,&local_808);
      wire::string::~string(&local_808);
      std::__cxx11::string::~string(local_828);
      std::allocator<char>::~allocator((allocator<char> *)&local_829);
      wire::string::~string((string *)local_650);
      wire::string::~string((string *)local_5e8);
    }
    wire::string::~string((string *)local_5c0);
  }
  pugi::xpath_node_set::~xpath_node_set((xpath_node_set *)&__begin1_4);
  return __return_storage_ptr__;
}

Assistant:

Output generate_output(const Manifest& manifest,
                       const Target& target,
                       const pugi::xml_document& spec)
{
  Output output;

  if (target.api == "gl")
    output.api_name = "OpenGL";
  else if (target.api == "gles1" || target.api == "gles2")
    output.api_name = "OpenGL ES";

  for (const wire::string& extension : manifest.extensions)
  {
    wire::string boolean_name = extension;
    if (boolean_name.starts_with("GL_"))
      boolean_name.replace(0, 3, "GREG_");

    output.ext_macros += wire::string("#define \1 1\n", extension);
    output.ext_declarations += wire::string("extern int \1;\n", boolean_name);
    output.ext_definitions += wire::string("GREGDEF int \1 = 0;\n", boolean_name);
    output.ext_loaders += wire::string("    \1 = gregExtensionSupported(\"\2\");\n",
                                       boolean_name,
                                       extension);
  }

  for (const Feature& feature : manifest.features)
  {
    wire::string boolean_name = feature.name;
    if (boolean_name.starts_with("GL_"))
      boolean_name.replace(0, 3, "GREG_");

    output.ver_macros += wire::string("#define \1 1\n", feature.name);
    output.ver_declarations += wire::string("extern int \1;\n", boolean_name);
    output.ver_definitions += wire::string("GREGDEF int \1 = 0;\n", boolean_name);
    output.ver_loaders += wire::string("    \1 = gregVersionSupported(\2, \3);\n",
                                       boolean_name,
                                       feature.version.major,
                                       feature.version.minor);
  }

  for (const auto ref : spec.select_nodes("/registry/types/type"))
  {
    const pugi::xml_node tn = ref.node();

    if (!manifest.types.count(type_name(tn)) || api_name(tn) != target.api)
      continue;

    output.type_typedefs += wire::string("\1\n", scrape_type_text(tn));
  }

  for (const auto ref : spec.select_nodes("/registry/enums/enum"))
  {
    const pugi::xml_node en = ref.node();

    if (!manifest.enums.count(en.attribute("name").value()))
      continue;

    output.enum_definitions += wire::string("#define \1 \2\n",
                                            en.attribute("name").value(),
                                            en.attribute("value").value());
  }

  for (const auto ref : spec.select_nodes("/registry/commands/command"))
  {
    const pugi::xml_node cn = ref.node();

    const wire::string function_name = cn.child("proto").child_value("name");
    if (!manifest.commands.count(function_name))
      continue;

    const wire::string typedef_name("PFN\1PROC", function_name.uppercase());
    const wire::string pointer_name("greg_\1", function_name);

    output.cmd_typedefs += wire::string("typedef \1 (GLAPIENTRY *\2)(\3);\n",
                                        scrape_proto_text(cn.child("proto")),
                                        typedef_name,
                                        command_params(cn));
    output.cmd_declarations += wire::string("extern \1 \2;\n",
                                            typedef_name,
                                            pointer_name);
    output.cmd_macros += wire::string("#define \1 \2\n",
                                      function_name,
                                      pointer_name);
    output.cmd_definitions += wire::string("GREGDEF \1 \2 = NULL;\n",
                                           typedef_name,
                                           pointer_name);
    output.cmd_loaders += wire::string("    \1 = (\2) gregGetProcAddress(\"\3\");\n",
                                       pointer_name,
                                       typedef_name,
                                       function_name);
  }

  return output;
}